

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  MessageOptions *pMVar1;
  long lVar2;
  FileOptions *pFVar3;
  undefined8 *puVar4;
  size_t __n;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  MessageOptions *pMVar8;
  FileOptions *pFVar9;
  ErrorLocation location;
  string *element_name;
  char *error;
  FieldDescriptor *local_58;
  undefined1 local_50 [32];
  
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_50._0_8_ = field;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),FieldDescriptor::TypeOnceInit,
                 (FieldDescriptor **)local_50);
    }
    if (*(long *)(field + 0x68) == 0) {
      return;
    }
  }
  if (*(char *)(*(long *)(field + 0x78) + 0x4d) == '\x01') {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_50._0_8_ = FieldDescriptor::TypeOnceInit;
      local_58 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_50,&local_58
                );
    }
    if (*(int *)(field + 0x38) != 0xb) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }
  if (*(char *)(*(long *)(field + 0x78) + 0x4c) == '\x01') {
    if (*(int *)(field + 0x3c) == 3) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_50._0_8_ = FieldDescriptor::TypeOnceInit;
        local_58 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_50,
                   &local_58);
      }
      if (*(int *)(field + 0x38) - 0xdU < 0xfffffffc) goto LAB_002da7d5;
    }
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "[packed = true] can only be specified for repeated primitive fields.");
  }
LAB_002da7d5:
  if (((*(long *)(field + 0x50) != 0) &&
      (pMVar1 = *(MessageOptions **)(*(long *)(field + 0x50) + 0x20),
      pMVar8 = MessageOptions::default_instance(), pMVar1 != pMVar8)) &&
     (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x48) == '\x01')) {
    if (field[0x42] == (FieldDescriptor)0x1) {
      if (*(int *)(field + 0x3c) == 1) {
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_50._0_8_ = FieldDescriptor::TypeOnceInit;
          local_58 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_50,
                     &local_58);
        }
        if (*(int *)(field + 0x38) == 0xb) goto LAB_002da866;
      }
      element_name = *(string **)(field + 8);
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    else {
      element_name = *(string **)(field + 8);
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    AddError(this,element_name,&proto->super_Message,location,error);
  }
LAB_002da866:
  lVar2 = *(long *)(field + 0x28);
  if ((((lVar2 != 0) &&
       (pFVar3 = *(FileOptions **)(lVar2 + 0x88), pFVar9 = FileOptions::default_instance(),
       pFVar3 != pFVar9)) &&
      ((*(int *)(*(long *)(lVar2 + 0x88) + 0xa4) == 3 && (*(long *)(field + 0x50) != 0)))) &&
     (((lVar2 = *(long *)(*(long *)(field + 0x50) + 0x10), lVar2 == 0 ||
       (pFVar3 = *(FileOptions **)(lVar2 + 0x88), pFVar9 = FileOptions::default_instance(),
       pFVar3 == pFVar9)) || (*(int *)(*(long *)(lVar2 + 0x88) + 0xa4) != 3)))) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_50._0_8_ = FieldDescriptor::TypeOnceInit;
    local_58 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_50,&local_58);
  }
  if (((*(int *)(field + 0x38) == 0xb) &&
      (*(char *)(*(long *)(*(long *)(field + 0x68) + 0x20) + 0x4b) == '\x01')) &&
     (bVar6 = ValidateMapEntry(this,field,proto), !bVar6)) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  ValidateJSType(this,field,proto);
  if ((field[0x42] == (FieldDescriptor)0x1) && (field[0x41] == (FieldDescriptor)0x1)) {
    puVar4 = *(undefined8 **)(field + 0x20);
    anon_unknown_1::ToJsonName((string *)local_50,*(string **)field);
    uVar5 = local_50._0_8_;
    __n = puVar4[1];
    if (__n == local_50._8_8_) {
      if (__n == 0) {
        bVar6 = false;
      }
      else {
        iVar7 = bcmp((void *)*puVar4,(void *)local_50._0_8_,__n);
        bVar6 = iVar7 != 0;
      }
    }
    else {
      bVar6 = true;
    }
    if ((FieldDescriptor *)uVar5 != (FieldDescriptor *)(local_50 + 0x10)) {
      operator_delete((void *)uVar5);
    }
    if (bVar6) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,OPTION_NAME,
               "option json_name is not allowed on extension fields.");
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (caculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // an user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

}